

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionDemodulation.cpp
# Opt level: O3

void __thiscall
Inferences::BackwardSubsumptionDemodulation::performWithQueryLit
          (BackwardSubsumptionDemodulation *this,Clause *sideCl,Literal *candidateQueryLit,
          vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
          *simplifications)

{
  long *plVar1;
  uint uVar2;
  _Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false> _Var3;
  Clause *this_00;
  Literal *pLVar4;
  char cVar5;
  void **head;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  rit;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> qr;
  long *local_60;
  long *local_58;
  int *local_50;
  undefined8 *local_48;
  BackwardSubsumptionDemodulation *local_40;
  vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
  *local_38;
  
  _Var3._M_head_impl =
       (((this->_index)._index)->super_LiteralIndex<Indexing::LiteralClause>)._is._M_t.
       super___uniq_ptr_impl<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_std::default_delete<Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_>_>
       .super__Head_base<0UL,_Indexing::LiteralIndexingStructure<Indexing::LiteralClause>_*,_false>.
       _M_head_impl;
  local_40 = this;
  local_38 = simplifications;
  (*(_Var3._M_head_impl)->_vptr_LiteralIndexingStructure[7])
            (&local_60,_Var3._M_head_impl,candidateQueryLit,0,0);
  do {
    cVar5 = (**(code **)(*local_60 + 0x10))();
    if (cVar5 == '\0') {
      if (local_60 != (long *)0x0) {
        plVar1 = local_60 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        if ((int)*plVar1 == 0) {
          (**(code **)(*local_60 + 8))();
        }
      }
      return;
    }
    (**(code **)(*local_60 + 0x18))();
    this_00 = (Clause *)local_48[1];
    uVar6 = *(ulong *)&this_00->field_0x38;
    if (((*(uint *)&sideCl->field_0x38 & 0xfffff) <= ((uint)uVar6 & 0xfffff)) &&
       (this_00->_auxTimestamp != Kernel::Clause::_auxCurrTimestamp)) {
      this_00->_auxTimestamp = Kernel::Clause::_auxCurrTimestamp;
      this_00->_auxData = (void *)0x0;
      uVar10 = (uint)*(undefined8 *)&sideCl->field_0x38;
      if ((~uVar10 & 0x300000) == 0) {
        Kernel::Clause::computeColor(sideCl);
        uVar10 = (uint)*(undefined8 *)&sideCl->field_0x38;
        uVar6 = *(ulong *)&this_00->field_0x38;
      }
      if ((~(uint)uVar6 & 0x300000) == 0) {
        Kernel::Clause::computeColor(this_00);
        uVar6 = *(ulong *)&this_00->field_0x38;
      }
      if ((~(uVar10 | (uint)uVar6) & 0x300000) != 0) {
        if ((*(ulong *)&sideCl->field_0x38 & 0xfffff) == 0) {
          uVar10 = 0;
        }
        else {
          uVar8 = 0;
          uVar10 = 0;
          uVar7 = 0;
          do {
            pLVar4 = sideCl->_literals[uVar8];
            if (pLVar4 != candidateQueryLit) {
              uVar2 = (pLVar4->super_Term)._functor;
              uVar9 = (uint)(pLVar4->super_Term)._args[0]._content >> 2;
              uVar7 = uVar7 + (uVar2 == 0 & (byte)uVar9);
              uVar2 = (uVar9 & 1) + uVar2 * 2;
              if (uVar10 < uVar2) {
                uVar10 = uVar2;
              }
            }
            uVar8 = uVar8 + 1;
          } while (((uint)*(ulong *)&sideCl->field_0x38 & 0xfffff) != uVar8);
          if ((uVar10 == 1) && (uVar7 < 2)) {
LAB_004a960e:
            simplifyCandidate(local_40,sideCl,this_00,local_38);
            goto LAB_004a9666;
          }
        }
        if ((uVar6 & 0xfffff) != 0) {
          uVar8 = 0;
          do {
            pLVar4 = this_00->_literals[uVar8];
            if ((pLVar4 != (Literal *)*local_48) &&
               (((uint)(pLVar4->super_Term)._args[0]._content >> 2 & 1) +
                (pLVar4->super_Term)._functor * 2 == uVar10)) goto LAB_004a960e;
            uVar8 = uVar8 + 1;
          } while (((uint)uVar6 & 0xfffff) != uVar8);
        }
      }
    }
LAB_004a9666:
    if (((local_58 != (long *)0x0) && (local_50 != (int *)0x0)) &&
       (*local_50 = *local_50 + -1, *local_50 == 0)) {
      (**(code **)(*local_58 + 8))();
      if (local_50 != (int *)0x0) {
        *(undefined8 *)local_50 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50;
      }
    }
  } while( true );
}

Assistant:

void BackwardSubsumptionDemodulation::performWithQueryLit(Clause* sideCl, Literal* candidateQueryLit, std::vector<BwSimplificationRecord>& simplifications)
{
  //   sideCl
  // vvvvvvvvvv
  //
  // l = r \/ C      CΘ \/ L[lΘ] \/ D
  // --------------------------------
  //       CΘ \/ L[rΘ] \/ D

#if VDEBUG
  // make sure DuplicateLiteralRemovalISE has been run on this
  DHSet<Literal*> lits;
  for (unsigned i = 0; i < sideCl->length(); ++i) {
    ALWAYS(lits.insert((*sideCl)[i]));
  }
#endif

  bool mustPredInit = false;
  bool mustPredActive = false;
  unsigned mustPred;

  auto rit = _index->getInstances(candidateQueryLit, false, false);
  while (rit.hasNext()) {
    auto qr = rit.next();
    Clause* candidate = qr.data->clause;

    // not enough literals to fit match and rewritten literal (performance)
    if (sideCl->length() > candidate->length()) {
      continue;
    }

    // this is impossible
    // (if it triggers, then skip the candidate. SD with twice the same clause is impossible. even if it were, FSD should have dealt with it.)
    ASS_NEQ(sideCl, candidate);

    if (candidate->hasAux()) {
      continue;  // we've already checked this premise
    }
    candidate->setAux(nullptr);

    if (!ColorHelper::compatible(sideCl->color(), candidate->color())) {
      continue;
    }

    RSTAT_CTR_INC("bsd 0 candidates");

    // Here we pick one literal header of the base clause and make sure that
    // every instance clause has it
    //
    // Possibilities to consider:
    // 1. Choose one that is not a positive equality, the other clause must contain it.
    // 2. Choose two positive equalities, the other clause must contain at least one of them. (but those are indistinguishable by literal header)
    // 3. If it's a two-literal clause where the only thing left here is the positive equality, we cannot (and should not) exclude anything with this check.
    //
    // Case A: candidateQueryLit is not a positive equality.
    // - there is at least one positive equality in the remaining literals
    // - we need to skip one positive equality for the "mustPred" check.
    // Case B: candidateQueryLit is a positive equality.
    // - in this case, there is another positive equality in sideCl due to selection of the candidateQueryLit.
    // - Case B.1: BSD where candidateQueryLit is the rewriting equality:
    //             => any of the others can be chosen as mustPred
    //             (this case doesn't really matter since it will be found by the other call to this function; with the other candidateQueryLit.)
    //   Case B.2: BSD where candidateQueryLit is not the rewriting equality:
    //             => we must skip one positive equality for the "mustPred" check
    //
    // Summary: must skip one positive equality in the remaining literals for this "mustPred" check.
    if (!mustPredInit) {
      unsigned const positiveEqualityHeader = 1;
#if VDEBUG
      // To verify the hard-coded value of positiveEqualityHeader
      Literal* posEq = Literal::createEquality(true, TermList(0, false), TermList(1, false), AtomicSort::defaultSort());
      ASS_EQ(posEq->header(), positiveEqualityHeader);
#endif
      unsigned numPosEqs = 0;
      //since the base clause has at least two children, this will always
      //contain an existing literal header after the loop
      mustPred = 0;  // header value 0 means positive equality
      for (unsigned bi = 0; bi < sideCl->length(); ++bi) {
        Literal* blit = (*sideCl)[bi];
        if (blit == candidateQueryLit) {
          continue;
        }
        // only count in the other literals (see case B.2)
        if (blit->isPositive() && blit->isEquality()) {
          ++numPosEqs;
        }
        unsigned pred = blit->header();
        if (pred > mustPred) {
          mustPred = pred;
        }
      }
      if (mustPred == positiveEqualityHeader) {
        // for positive equality we need to have skipped at least in the remaining literals
        mustPredActive = (numPosEqs >= 2);
      } else {
        mustPredActive = true;
      }
    }
    if (mustPredActive) {
      bool haveMustPred = false;
      for (unsigned ii = 0; ii < candidate->length(); ++ii) {
        Literal* lit = (*candidate)[ii];
        if (lit == qr.data->literal) {
          continue;
        }
        unsigned pred = lit->header();
        if (pred == mustPred) {
          haveMustPred = true;
          break;
        }
      }
      if (!haveMustPred) {
        continue;
      }
    }
    RSTAT_CTR_INC("bsd 1 mustPred survivors");

    simplifyCandidate(sideCl, candidate, simplifications);
  }
}